

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O1

Vec_Ptr_t * Ptr_AbcDeriveNode(Abc_Obj_t *pObj)

{
  Abc_NtkFunc_t AVar1;
  uint uVar2;
  Abc_Obj_t *pObj_00;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  
  uVar8 = (pObj->vFanins).nSize * 2 + 4;
  if ((int)uVar8 < 0) {
    __assert_fail("nCap >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                  ,99,"Vec_Ptr_t *Vec_PtrAllocExact(int)");
  }
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nSize = 0;
  pVVar4->nCap = uVar8;
  if (uVar8 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((ulong)uVar8 << 3);
  }
  pVVar4->pArray = ppvVar5;
  if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x72,"Vec_Ptr_t *Ptr_AbcDeriveNode(Abc_Obj_t *)");
  }
  AVar1 = pObj->pNtk->ntkFunc;
  if (AVar1 == ABC_FUNC_SOP) {
    pcVar7 = *(char **)&(pObj->field_5).iData;
    iVar3 = strcmp(pcVar7," 0\n");
    if (iVar3 == 0) {
      pcVar6 = "BAC_BOX_C0";
    }
    else {
      iVar3 = strcmp(pcVar7," 1\n");
      if (iVar3 == 0) {
        pcVar6 = "BAC_BOX_C1";
      }
      else {
        iVar3 = strcmp(pcVar7,"1 1\n");
        if (iVar3 == 0) {
          pcVar6 = "BAC_BOX_BUF";
        }
        else {
          iVar3 = strcmp(pcVar7,"0 1\n");
          if (iVar3 == 0) {
            pcVar6 = "BAC_BOX_INV";
          }
          else {
            iVar3 = strcmp(pcVar7,"11 1\n");
            if (iVar3 == 0) {
              pcVar6 = "BAC_BOX_AND";
            }
            else {
              iVar3 = strcmp(pcVar7,"00 1\n");
              if (iVar3 == 0) {
                pcVar6 = "BAC_BOX_NOR";
              }
              else {
                iVar3 = strcmp(pcVar7,"00 0\n");
                pcVar6 = "BAC_BOX_OR";
                if (((iVar3 != 0) && (iVar3 = strcmp(pcVar7,"-1 1\n1- 1\n"), iVar3 != 0)) &&
                   (iVar3 = strcmp(pcVar7,"1- 1\n-1 1\n"), iVar3 != 0)) {
                  iVar3 = strcmp(pcVar7,"01 1\n10 1\n");
                  pcVar6 = "BAC_BOX_XOR";
                  if ((iVar3 != 0) && (iVar3 = strcmp(pcVar7,"10 1\n01 1\n"), iVar3 != 0)) {
                    iVar3 = strcmp(pcVar7,"11 1\n00 1\n");
                    pcVar6 = "BAC_BOX_XNOR";
                    if ((iVar3 != 0) && (iVar3 = strcmp(pcVar7,"00 1\n11 1\n"), iVar3 != 0)) {
                      iVar3 = strcmp(pcVar7,"10 1\n");
                      if (iVar3 == 0) {
                        pcVar6 = "BAC_BOX_SHARP";
                      }
                      else {
                        iVar3 = strcmp(pcVar7,"01 1\n");
                        if (iVar3 != 0) {
                          __assert_fail("0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                                        ,0x396,"char *Ptr_SopToTypeName(char *)");
                        }
                        pcVar6 = "BAC_BOX_SHARPL";
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (uVar8 == 0) {
      if (ppvVar5 != (void **)0x0) goto LAB_00391882;
LAB_00391a53:
      ppvVar5 = (void **)malloc(0x80);
      goto LAB_00391a5d;
    }
  }
  else {
    if (AVar1 != ABC_FUNC_AIG) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                    ,0x77,"Vec_Ptr_t *Ptr_AbcDeriveNode(Abc_Obj_t *)");
    }
    pcVar6 = Ptr_HopToType(pObj);
    if (uVar8 == 0) {
      if (ppvVar5 == (void **)0x0) goto LAB_00391a53;
LAB_00391882:
      ppvVar5 = (void **)realloc(ppvVar5,0x80);
LAB_00391a5d:
      pVVar4->pArray = ppvVar5;
      pVVar4->nCap = 0x10;
    }
  }
  pVVar4->nSize = 1;
  *pVVar4->pArray = pcVar6;
  pcVar7 = Ptr_AbcObjName(pObj);
  if (pVVar4->nCap == 1) {
    if (pVVar4->pArray == (void **)0x0) {
      ppvVar5 = (void **)malloc(0x80);
    }
    else {
      ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
    }
    pVVar4->pArray = ppvVar5;
    pVVar4->nCap = 0x10;
  }
  iVar3 = pVVar4->nSize;
  pVVar4->nSize = iVar3 + 1;
  pVVar4->pArray[iVar3] = pcVar7;
  if (2 < (pObj->vFanins).nSize) {
    __assert_fail("Abc_ObjFaninNum(pObj) <= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x79,"Vec_Ptr_t *Ptr_AbcDeriveNode(Abc_Obj_t *)");
  }
  if (0 < (pObj->vFanins).nSize) {
    uVar8 = pVVar4->nCap;
    iVar3 = pVVar4->nSize;
    ppvVar5 = pVVar4->pArray;
    lVar9 = 0;
    lVar10 = 0;
    do {
      pObj_00 = (Abc_Obj_t *)
                pObj->pNtk->vObjs->pArray[*(int *)((long)(pObj->vFanins).pArray + lVar9 * 2)];
      pcVar7 = " TXr; >Xrs Yqo o!Yq oHYq oqYa 7Yq Y87q 7HYq Ya7q SoYq YqoS! oZYq YqaoZ rY r";
      if (lVar9 == 0) {
        pcVar7 = "*?BN -ke?aN ke*?1N :ek?-N ke?B1*N ak:e?-N ?Qke* ?-Qke Qke?T* ?Qe-Tk l?Qe* l";
      }
      if (iVar3 + (int)lVar9 == uVar8) {
        if ((int)uVar8 < 0x10) {
          if (ppvVar5 == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(ppvVar5,0x80);
          }
          uVar8 = 0x10;
        }
        else {
          uVar2 = uVar8 * 2;
          if (SBORROW4(uVar8,uVar2) != 0 < (int)uVar8) {
            uVar8 = uVar2;
            if (ppvVar5 == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar2 << 3);
            }
            else {
              ppvVar5 = (void **)realloc(ppvVar5,(ulong)uVar2 << 3);
            }
          }
        }
      }
      ppvVar5[iVar3 + lVar9] = pcVar7 + 0x4a;
      pcVar7 = Ptr_AbcObjName(pObj_00);
      if (iVar3 + (int)lVar9 + 1U == uVar8) {
        if ((int)uVar8 < 0x10) {
          if (ppvVar5 == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(ppvVar5,0x80);
          }
          uVar8 = 0x10;
        }
        else {
          uVar2 = uVar8 * 2;
          if (SBORROW4(uVar8,uVar2) != 0 < (int)uVar8) {
            uVar8 = uVar2;
            if (ppvVar5 == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar2 << 3);
            }
            else {
              ppvVar5 = (void **)realloc(ppvVar5,(ulong)uVar2 << 3);
            }
          }
        }
      }
      ppvVar5[(long)iVar3 + lVar9 + 1] = pcVar7;
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 2;
    } while (lVar10 < (pObj->vFanins).nSize);
    pVVar4->nSize = iVar3 + (int)lVar9;
    pVVar4->nCap = uVar8;
    pVVar4->pArray = ppvVar5;
  }
  uVar8 = pVVar4->nSize;
  uVar2 = pVVar4->nCap;
  if (uVar8 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
      }
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar2 * 2;
      if (iVar3 <= (int)uVar2) goto LAB_00391cd3;
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
      }
    }
    pVVar4->pArray = ppvVar5;
    pVVar4->nCap = iVar3;
  }
LAB_00391cd3:
  ppvVar5 = pVVar4->pArray;
  pVVar4->nSize = uVar8 + 1;
  ppvVar5[(int)uVar8] = "o";
  pcVar7 = Ptr_AbcObjName(pObj);
  uVar2 = pVVar4->nCap;
  if (uVar8 + 1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (ppvVar5 == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(ppvVar5,0x80);
      }
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar2 * 2;
      if (iVar3 <= (int)uVar2) goto LAB_00391d51;
      if (ppvVar5 == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(ppvVar5,(ulong)uVar2 << 4);
      }
    }
    pVVar4->pArray = ppvVar5;
    pVVar4->nCap = iVar3;
  }
LAB_00391d51:
  pVVar4->nSize = uVar8 + 2;
  pVVar4->pArray[(long)(int)uVar8 + 1] = pcVar7;
  if (uVar8 + 2 != pVVar4->nCap) {
    __assert_fail("Vec_PtrSize(vArray) == Vec_PtrCap(vArray)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x6b,"int Ptr_CheckArray(Vec_Ptr_t *)");
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Ptr_AbcDeriveNode( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin; int i;
    Vec_Ptr_t * vNode = Vec_PtrAllocExact( 2 + 2 * (1 + Abc_ObjFaninNum(pObj)) );
    assert( Abc_ObjIsNode(pObj) );
    if ( Abc_NtkHasAig(pObj->pNtk) )
        Vec_PtrPush( vNode, Ptr_HopToType(pObj) );
    else if ( Abc_NtkHasSop(pObj->pNtk) )
        Vec_PtrPush( vNode, Ptr_SopToTypeName((char *)pObj->pData) );
    else assert( 0 );
    Vec_PtrPush( vNode, Ptr_AbcObjName(pObj) );
    assert( Abc_ObjFaninNum(pObj) <= 2 );
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        Vec_PtrPush( vNode, (void*)(i ? "r" : "l") );
        Vec_PtrPush( vNode, Ptr_AbcObjName(pFanin) );
    }
    Vec_PtrPush( vNode, (void*)("o") );
    Vec_PtrPush( vNode, Ptr_AbcObjName(pObj) );
    assert( Ptr_CheckArray(vNode) );
    return vNode;
}